

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNodePtr xmlStringGetNodeList(xmlDoc *doc,xmlChar *value)

{
  byte bVar1;
  int iVar2;
  xmlBufPtr buf;
  xmlChar *pxVar3;
  xmlEntityPtr pxVar4;
  xmlNodePtr pxVar5;
  xmlChar *pxVar6;
  xmlNodePtr pxVar7;
  xmlNodePtr elem;
  _xmlNode *p_Var8;
  long lVar9;
  byte *pbVar10;
  byte *pbVar11;
  byte *pbVar12;
  bool bVar13;
  xmlChar buffer [10];
  xmlNodePtr local_50;
  xmlChar local_3a [10];
  
  if (value == (xmlChar *)0x0) {
    pxVar7 = (xmlNodePtr)0x0;
  }
  else {
    pxVar7 = (xmlNodePtr)0x0;
    buf = xmlBufCreateSize(0);
    if (buf != (xmlBufPtr)0x0) {
      xmlBufSetAllocationScheme(buf,XML_BUFFER_ALLOC_HYBRID);
      local_50 = (xmlNodePtr)0x0;
      elem = (xmlNodePtr)0x0;
      pbVar11 = value;
      do {
        pbVar12 = pbVar11 + 3;
        pbVar10 = pbVar11;
        while( true ) {
          pbVar10 = pbVar10 + 1;
          if (*pbVar11 == 0) {
            if ((pbVar11 != value) || (elem == (xmlNodePtr)0x0)) {
              xmlBufAdd(buf,value,(int)pbVar11 - (int)value);
            }
            iVar2 = xmlBufIsEmpty(buf);
            pxVar7 = elem;
            if (iVar2 == 0) {
              pxVar5 = xmlNewText((xmlChar *)0x0);
              pxVar7 = (xmlNodePtr)0x0;
              if (pxVar5 != (xmlNodePtr)0x0) {
                pxVar5->doc = doc;
                pxVar3 = xmlBufDetach(buf);
                pxVar5->content = pxVar3;
                pxVar7 = pxVar5;
                if (local_50 != (xmlNodePtr)0x0) {
                  xmlAddNextSibling(local_50,pxVar5);
                  pxVar7 = elem;
                }
              }
            }
            goto LAB_001885ac;
          }
          if (*pbVar11 == 0x26) break;
          pbVar11 = pbVar11 + 1;
          pbVar12 = pbVar12 + 1;
        }
        if ((pbVar11 == value) ||
           (iVar2 = xmlBufAdd(buf,value,(int)pbVar11 - (int)value), iVar2 == 0)) {
          if (pbVar11[1] == 0x23) {
            if (pbVar11[2] == 0x78) {
              bVar1 = pbVar11[3];
              pbVar11 = pbVar11 + 3;
              iVar2 = 0;
              bVar13 = bVar1 == 0x3b;
              if (!bVar13) {
                iVar2 = 0;
                do {
                  if ((byte)(bVar1 - 0x30) < 10) {
                    iVar2 = iVar2 * 0x10 + (uint)bVar1 + -0x30;
                  }
                  else if ((byte)(bVar1 + 0x9f) < 6) {
                    iVar2 = iVar2 * 0x10 + (uint)bVar1 + -0x57;
                  }
                  else {
                    if (5 < (byte)(bVar1 + 0xbf)) {
                      iVar2 = 0;
                      __xmlSimpleError(2,0x514,(xmlNodePtr)doc,
                                       "invalid hexadecimal character value\n",(char *)0x0);
                      break;
                    }
                    iVar2 = iVar2 * 0x10 + (uint)bVar1 + -0x37;
                  }
                  bVar1 = pbVar11[1];
                  pbVar11 = pbVar11 + 1;
                  bVar13 = bVar1 == 0x3b;
                } while (!bVar13);
              }
            }
            else {
              bVar1 = pbVar11[2];
              pbVar11 = pbVar11 + 2;
              iVar2 = 0;
              bVar13 = bVar1 == 0x3b;
              if (!bVar13) {
                if ((byte)(bVar1 - 0x30) < 10) {
                  iVar2 = 0;
                  do {
                    pbVar11 = pbVar12;
                    iVar2 = (uint)bVar1 + iVar2 * 10 + -0x30;
                    bVar1 = *pbVar11;
                    bVar13 = bVar1 == 0x3b;
                    if (bVar13) goto LAB_00188541;
                    pbVar12 = pbVar11 + 1;
                  } while ((byte)(bVar1 - 0x30) < 10);
                }
                iVar2 = 0;
                __xmlSimpleError(2,0x515,(xmlNodePtr)doc,"invalid decimal character value\n",
                                 (char *)0x0);
              }
            }
LAB_00188541:
            value = pbVar11 + bVar13;
LAB_00188544:
            pbVar11 = value;
            if (iVar2 != 0) {
              iVar2 = xmlCopyCharMultiByte(local_3a,iVar2);
              local_3a[iVar2] = '\0';
              iVar2 = xmlBufCat(buf,local_3a);
              bVar13 = iVar2 == 0;
              if (!bVar13) goto LAB_00188575;
            }
            bVar13 = true;
          }
          else {
            value = pbVar11 + 1;
            lVar9 = 0;
LAB_00188380:
            if (*pbVar10 == 0) {
              __xmlSimpleError(2,0x516,(xmlNodePtr)doc,"unterminated entity reference %15s\n",
                               (char *)value);
            }
            else {
              if (*pbVar10 != 0x3b) goto code_r0x0018838e;
              if (lVar9 == 0) goto LAB_00188533;
              pxVar3 = xmlStrndup(value,-(int)lVar9);
              pxVar4 = xmlGetDocEntity(doc,pxVar3);
              if ((pxVar4 == (xmlEntityPtr)0x0) || (pxVar4->etype != XML_INTERNAL_PREDEFINED_ENTITY)
                 ) {
                iVar2 = xmlBufIsEmpty(buf);
                pxVar5 = elem;
                pxVar7 = local_50;
                if (iVar2 == 0) {
                  pxVar5 = xmlNewText((xmlChar *)0x0);
                  if (pxVar5 != (xmlNodePtr)0x0) {
                    pxVar5->doc = doc;
                  }
                  pxVar6 = xmlBufDetach(buf);
                  pxVar5->content = pxVar6;
                  pxVar7 = pxVar5;
                  if (local_50 != (xmlNodePtr)0x0) {
                    pxVar7 = xmlAddNextSibling(local_50,pxVar5);
                    pxVar5 = elem;
                  }
                }
                local_50 = pxVar7;
                elem = xmlNewReference(doc,pxVar3);
                if (elem != (xmlNodePtr)0x0) {
                  if ((pxVar4 != (xmlEntityPtr)0x0) && (pxVar4->children == (_xmlNode *)0x0)) {
                    pxVar4->children = (_xmlNode *)0xffffffffffffffff;
                    pxVar7 = xmlStringGetNodeList(doc,elem->content);
                    pxVar4->children = pxVar7;
                    pxVar4->owner = 1;
                    if (pxVar7 != (xmlNodePtr)0x0) {
                      do {
                        p_Var8 = pxVar7;
                        p_Var8->parent = (_xmlNode *)pxVar4;
                        pxVar7 = p_Var8->next;
                      } while (p_Var8->next != (_xmlNode *)0x0);
                      pxVar4->last = p_Var8;
                    }
                  }
                  pxVar7 = elem;
                  if (local_50 != (xmlNodePtr)0x0) {
                    pxVar7 = xmlAddNextSibling(local_50,elem);
                    elem = pxVar5;
                  }
LAB_00188527:
                  local_50 = pxVar7;
                  (*xmlFree)(pxVar3);
LAB_00188533:
                  value = pbVar10 + 1;
                  iVar2 = 0;
                  goto LAB_00188544;
                }
                elem = pxVar5;
                if (pxVar3 != (xmlChar *)0x0) {
                  (*xmlFree)(pxVar3);
                }
              }
              else {
                iVar2 = xmlBufCat(buf,pxVar4->content);
                pxVar7 = local_50;
                if (iVar2 == 0) goto LAB_00188527;
              }
            }
            bVar13 = false;
            pbVar11 = pbVar10;
          }
        }
        else {
          bVar13 = false;
        }
LAB_00188575:
        pxVar7 = elem;
      } while (bVar13);
LAB_001885ac:
      xmlBufFree(buf);
    }
  }
  return pxVar7;
code_r0x0018838e:
  pbVar10 = pbVar10 + 1;
  lVar9 = lVar9 + -1;
  goto LAB_00188380;
}

Assistant:

xmlNodePtr
xmlStringGetNodeList(const xmlDoc *doc, const xmlChar *value) {
    xmlNodePtr ret = NULL, last = NULL;
    xmlNodePtr node;
    xmlChar *val;
    const xmlChar *cur = value;
    const xmlChar *q;
    xmlEntityPtr ent;
    xmlBufPtr buf;

    if (value == NULL) return(NULL);

    buf = xmlBufCreateSize(0);
    if (buf == NULL) return(NULL);
    xmlBufSetAllocationScheme(buf, XML_BUFFER_ALLOC_HYBRID);

    q = cur;
    while (*cur != 0) {
	if (cur[0] == '&') {
	    int charval = 0;
	    xmlChar tmp;

	    /*
	     * Save the current text.
	     */
            if (cur != q) {
		if (xmlBufAdd(buf, q, cur - q))
		    goto out;
	    }
	    q = cur;
	    if ((cur[1] == '#') && (cur[2] == 'x')) {
		cur += 3;
		tmp = *cur;
		while (tmp != ';') { /* Non input consuming loop */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 16 + (tmp - '0');
		    else if ((tmp >= 'a') && (tmp <= 'f'))
			charval = charval * 16 + (tmp - 'a') + 10;
		    else if ((tmp >= 'A') && (tmp <= 'F'))
			charval = charval * 16 + (tmp - 'A') + 10;
		    else {
			xmlTreeErr(XML_TREE_INVALID_HEX, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    tmp = *cur;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else if  (cur[1] == '#') {
		cur += 2;
		tmp = *cur;
		while (tmp != ';') { /* Non input consuming loops */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 10 + (tmp - '0');
		    else {
			xmlTreeErr(XML_TREE_INVALID_DEC, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    tmp = *cur;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else {
		/*
		 * Read the entity string
		 */
		cur++;
		q = cur;
		while ((*cur != 0) && (*cur != ';')) cur++;
		if (*cur == 0) {
		    xmlTreeErr(XML_TREE_UNTERMINATED_ENTITY,
		               (xmlNodePtr) doc, (const char *) q);
		    goto out;
		}
		if (cur != q) {
		    /*
		     * Predefined entities don't generate nodes
		     */
		    val = xmlStrndup(q, cur - q);
		    ent = xmlGetDocEntity(doc, val);
		    if ((ent != NULL) &&
			(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {

			if (xmlBufCat(buf, ent->content))
			    goto out;

		    } else {
			/*
			 * Flush buffer so far
			 */
			if (!xmlBufIsEmpty(buf)) {
			    node = xmlNewDocText(doc, NULL);
			    node->content = xmlBufDetach(buf);

			    if (last == NULL) {
				last = ret = node;
			    } else {
				last = xmlAddNextSibling(last, node);
			    }
			}

			/*
			 * Create a new REFERENCE_REF node
			 */
			node = xmlNewReference(doc, val);
			if (node == NULL) {
			    if (val != NULL) xmlFree(val);
			    goto out;
			}
			else if ((ent != NULL) && (ent->children == NULL)) {
			    xmlNodePtr temp;

                            /* Set to non-NULL value to avoid recursion. */
			    ent->children = (xmlNodePtr) -1;
			    ent->children = xmlStringGetNodeList(doc,
				    (const xmlChar*)node->content);
			    ent->owner = 1;
			    temp = ent->children;
			    while (temp) {
				temp->parent = (xmlNodePtr)ent;
				ent->last = temp;
				temp = temp->next;
			    }
			}
			if (last == NULL) {
			    last = ret = node;
			} else {
			    last = xmlAddNextSibling(last, node);
			}
		    }
		    xmlFree(val);
		}
		cur++;
		q = cur;
	    }
	    if (charval != 0) {
		xmlChar buffer[10];
		int len;

		len = xmlCopyCharMultiByte(buffer, charval);
		buffer[len] = 0;

		if (xmlBufCat(buf, buffer))
		    goto out;
		charval = 0;
	    }
	} else
	    cur++;
    }
    if ((cur != q) || (ret == NULL)) {
        /*
	 * Handle the last piece of text.
	 */
	xmlBufAdd(buf, q, cur - q);
    }

    if (!xmlBufIsEmpty(buf)) {
	node = xmlNewDocText(doc, NULL);
        if (node == NULL) {
            xmlBufFree(buf);
            return(NULL);
        }
	node->content = xmlBufDetach(buf);

	if (last == NULL) {
	    ret = node;
	} else {
	    xmlAddNextSibling(last, node);
	}
    }

out:
    xmlBufFree(buf);
    return(ret);
}